

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoApproveReporter.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::AutoApproveReporter::report
          (AutoApproveReporter *this,string *received,string *approved)

{
  ostream *poVar1;
  string *in_RDX;
  
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"file ");
  poVar1 = ::std::operator<<(poVar1,in_RDX);
  ::std::operator<<(poVar1," automatically approved - next run should succeed\n");
  FileUtilsSystemSpecific::copyFile((string *)this,received);
  return true;
}

Assistant:

bool AutoApproveReporter::report(std::string received, std::string approved) const
    {
        std::cout << "file " << approved
                  << " automatically approved - next run should succeed\n";
        FileUtilsSystemSpecific::copyFile(received, approved);
        return true;
    }